

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

string * __thiscall AmpIO::ExplainSiFault_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  ushort uVar1;
  uint uVar2;
  char cVar3;
  uint32_t uVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  uVar4 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar4 != 0x64524131) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Not a Si controller","");
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar2 = this->ReadBuffer[1];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Explaining faults in the Si controller:",0x27);
  cVar3 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"1. Interlocks that are preventing the axis from turning on:",0x3b
            );
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if ((uVar2 & 1) == 0) {
    lVar7 = 0x3e;
    pcVar8 = "ESPM->dVRK communication failed. Robot not programmed? Cables?";
  }
  else {
    if ((uVar2 & 2) != 0) goto LAB_00109a3d;
    lVar7 = 0x44;
    pcVar8 = "ESII/CC->ESPM communication failed. The problem is inside the robot.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar7);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
LAB_00109a3d:
  if ((uVar2 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Encoder preload is out of sync. You must preload encoder at least once.",0x47);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  uVar2 = this->ReadBuffer[1];
  BoardIO::GetHardwareVersion((BoardIO *)this);
  if ((uVar2 >> 0x13 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"48V bad. E-stop pressed?",0x18);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  if ((*(byte *)((long)this->ReadBuffer + 6) & 0x80) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Watchdog timeout.",0x11);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(end)",5);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"2. Amps that are in fault state:",0x20);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  if (this->NumMotors != 0) {
    uVar9 = 0;
    do {
      uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)this);
      if ((7 < uVar4) &&
         (uVar1 = *(ushort *)
                   ((long)this->ReadBuffer + (ulong)(this->MOTOR_STATUS_OFFSET + (int)uVar9) * 4 + 2
                   ), (uVar1 & 0xf) != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Amp ",4);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        pcVar8 = *(char **)(&DAT_00122530 + ((ulong)uVar1 & 0xf) * 8);
        sVar6 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->NumMotors);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(end)",5);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ExplainSiFault() const
{
    if (GetHardwareVersion() != dRA1_String) {
        return "Not a Si controller";
    }
    std::stringstream ss;
    const char* amp_fault_text[16] = {"-", "ADC saturated", "Current deviation", "HW overcurrent", "HW overtemp", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined"};
    uint32_t status = GetStatus();
    ss << "Explaining faults in the Si controller:" << std::endl;
    ss << std::endl;
    ss << "1. Interlocks that are preventing the axis from turning on:" << std::endl;
    if (!(status & (1 << 0))) ss << "ESPM->dVRK communication failed. Robot not programmed? Cables?" << std::endl;
    if ((status & (1 << 0)) && !(status & (1 << 1))) ss << "ESII/CC->ESPM communication failed. The problem is inside the robot." << std::endl;
    if (!(status & (1 << 3))) ss << "Encoder preload is out of sync. You must preload encoder at least once." << std::endl;
    if (!GetPowerStatus()) ss << "48V bad. E-stop pressed?" << std::endl;
    if (GetWatchdogTimeoutStatus()) ss << "Watchdog timeout." << std::endl;
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << "2. Amps that are in fault state:" << std::endl;
    for (unsigned int i = 0; i < NumMotors; i++) {
        // std::cout << NumMotors << std::endl;
        uint32_t amp_fault = GetAmpFaultCode(i);
        // std::cout << amp_fault << std::endl;
        if (amp_fault) {
            ss << "Amp " << i << ": " << amp_fault_text[amp_fault] << std::endl;
        }
    }
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << std::endl;
    return ss.str();
}